

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sobel.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  arguments_t args;
  Mat image;
  string local_108;
  void *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  arguments_t local_d0;
  string local_88 [16];
  long local_78;
  _InputArray local_28;
  
  arguments_t::arguments_t(&local_d0,argc,argv);
  sVar1 = arguments_t::parametersSize(&local_d0);
  if (sVar1 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b100);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," input output",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  else {
    arguments_t::operator[][abi_cxx11_(&local_108,&local_d0,0);
    cv::imread(local_88,(int)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if (local_78 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot load ",0xc);
      arguments_t::operator[][abi_cxx11_(&local_108,&local_d0,0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_108._M_dataplus._M_p,
                          local_108._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    else {
      gaussianFilter((Mat *)local_88,1,1.0);
      sobelFilter((Mat *)local_88);
      binaryFilter((Mat *)local_88,0.5);
      arguments_t::operator[][abi_cxx11_(&local_108,&local_d0,1);
      local_28.sz.width = 0;
      local_28.sz.height = 0;
      local_28.flags = 0x1010000;
      local_d8 = 0;
      local_e8 = (void *)0x0;
      uStack_e0 = 0;
      local_28.obj = (Mat *)local_88;
      cv::imwrite((string *)&local_108,&local_28,(vector *)&local_e8);
      if (local_e8 != (void *)0x0) {
        operator_delete(local_e8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    cv::Mat::~Mat((Mat *)local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.parameters);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_d0);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    arguments_t args(argc, argv);

	if (args.parametersSize() < 2) {
		std::cout << "usage: " << argv[0] << " input output" << std::endl;
		return 0;
	}

    auto image = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
	if (!image.data) {
		std::cout << "Cannot load " << args[0] << std::endl;
		return 0;
	}

	gaussianFilter(image, 1, 1);
    sobelFilter(image);
    binaryFilter(image, 0.5);

    cv::imwrite(args[1], image);

    return 0;
}